

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_internal_dump_to_stdout(char *data,unsigned_long ldata)

{
  unsigned_long uVar1;
  
  uVar1 = write(1,data,ldata);
  if (uVar1 == ldata) {
    return;
  }
  (*mcpl_error_handler)("Problems writing to stdout");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_internal_dump_to_stdout( const char * data,
                                   unsigned long ldata )
{
#ifdef _WIN32
  int the_stdout_fileno = _fileno(stdout);
  if ( the_stdout_fileno == -2 )
    mcpl_error("stdout is not associated with an output stream");
  if ( the_stdout_fileno == -1 )
    mcpl_error("could not determine file number of stdout");
  int oldmode = _setmode(the_stdout_fileno, O_BINARY);
  int nb = _write(the_stdout_fileno,data,ldata);
  if ( oldmode != O_BINARY )
    _setmode(the_stdout_fileno, oldmode);
  if (nb!=(int)ldata)
    mcpl_error("Problems writing to stdout");
#else
  ssize_t nb = write(STDOUT_FILENO,data,ldata);
  if (nb!=(ssize_t)ldata)
    mcpl_error("Problems writing to stdout");
#endif
}